

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O1

void ArgumentCheck(string *identifier_name,int line_number,int character_number,
                  vector<_SymbolType,_std::allocator<_SymbolType>_> *value_argument_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LogTools *this;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  uint uVar5;
  long *plVar6;
  size_type *psVar7;
  ulong *puVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  string str2;
  string str1;
  string __str_1;
  string __str;
  vector<_SymbolType,_std::allocator<_SymbolType>_> argument_type;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  LogTools *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  vector<_SymbolType,_std::allocator<_SymbolType>_> local_58;
  vector<_SymbolType,_std::allocator<_SymbolType>_> *local_40;
  ulong local_38;
  
  bVar2 = FunctionTable::Find(handle_func_table,identifier_name);
  if (!bVar2) {
    return;
  }
  local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FunctionTable::GetTermArgumentType(handle_func_table,identifier_name,&local_58);
  local_a0 = g_log_tools;
  uVar15 = (ulong)((long)local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar17 = (ulong)((long)(value_argument_type->
                         super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(value_argument_type->
                        super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  uVar14 = (uint)uVar15;
  uVar16 = (uint)uVar17;
  if (uVar14 == uVar16) {
    local_a0 = (LogTools *)identifier_name;
    if (0 < (int)uVar16) {
      uVar15 = (ulong)(uVar16 & 0x7fffffff);
      uVar17 = 0;
      local_40 = value_argument_type;
      local_38 = uVar15;
      do {
        if (local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
            super__Vector_impl_data._M_start[uVar17] !=
            (value_argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>).
            _M_impl.super__Vector_impl_data._M_start[uVar17]) {
          std::__cxx11::string::string
                    ((string *)&local_c0,
                     symbol_type_string
                     [local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl
                      .super__Vector_impl_data._M_start[uVar17]],(allocator *)&local_100);
          std::__cxx11::string::string
                    ((string *)&local_100,
                     symbol_type_string
                     [(value_argument_type->
                      super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar17]],(allocator *)&local_e0);
          this = g_log_tools;
          std::operator+(&local_98,"argument expected: ",&local_c0);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
          plVar6 = plVar3 + 2;
          if ((long *)*plVar3 == plVar6) {
            local_68 = *plVar6;
            lStack_60 = plVar3[3];
            local_78 = &local_68;
          }
          else {
            local_68 = *plVar6;
            local_78 = (long *)*plVar3;
          }
          local_70 = plVar3[1];
          *plVar3 = (long)plVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_100);
          psVar7 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_e0.field_2._M_allocated_capacity = *psVar7;
            local_e0.field_2._8_8_ = plVar3[3];
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar7;
            local_e0._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_e0._M_string_length = plVar3[1];
          *plVar3 = (long)psVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          LogTools::SemanticErrorLogs
                    (this,&local_e0,(string *)local_a0,line_number,character_number);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          value_argument_type = local_40;
          if (local_78 != &local_68) {
            operator_delete(local_78);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          if (local_100 != &local_f0) {
            operator_delete(local_100);
          }
          uVar15 = local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
            uVar15 = local_38;
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar15 != uVar17);
    }
    goto LAB_0012fd8b;
  }
  uVar13 = -uVar14;
  if (0 < (int)uVar14) {
    uVar13 = uVar14;
  }
  uVar12 = 1;
  if (9 < uVar13) {
    uVar10 = (ulong)uVar13;
    uVar5 = 4;
    do {
      uVar12 = uVar5;
      uVar9 = (uint)uVar10;
      if (uVar9 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_0012fada;
      }
      if (uVar9 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_0012fada;
      }
      if (uVar9 < 10000) goto LAB_0012fada;
      uVar10 = uVar10 / 10000;
      uVar5 = uVar12 + 4;
    } while (99999 < uVar9);
    uVar12 = uVar12 + 1;
  }
LAB_0012fada:
  local_78 = &local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar12 - ((char)(uVar15 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar14 >> 0x1f) + (long)local_78),uVar12,uVar13);
  puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x16157f);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar7 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_e0.field_2._M_allocated_capacity = *psVar7;
    local_e0.field_2._8_8_ = puVar4[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar7;
    local_e0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_e0._M_string_length = puVar4[1];
  *puVar4 = psVar7;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
  puVar8 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar8) {
    local_f0 = *puVar8;
    lStack_e8 = plVar3[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *puVar8;
    local_100 = (ulong *)*plVar3;
  }
  local_f8 = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar14 = -uVar16;
  if (0 < (int)uVar16) {
    uVar14 = uVar16;
  }
  uVar13 = 1;
  if (9 < uVar14) {
    uVar15 = (ulong)uVar14;
    uVar12 = 4;
    do {
      uVar13 = uVar12;
      uVar5 = (uint)uVar15;
      if (uVar5 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0012fc37;
      }
      if (uVar5 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0012fc37;
      }
      if (uVar5 < 10000) goto LAB_0012fc37;
      uVar15 = uVar15 / 10000;
      uVar12 = uVar13 + 4;
    } while (99999 < uVar5);
    uVar13 = uVar13 + 1;
  }
LAB_0012fc37:
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar13 - ((char)(uVar17 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_98._M_dataplus._M_p + (uVar16 >> 0x1f),uVar13,uVar14);
  uVar15 = 0xf;
  if (local_100 != &local_f0) {
    uVar15 = local_f0;
  }
  if (uVar15 < local_98._M_string_length + local_f8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      uVar11 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_98._M_string_length + local_f8) goto LAB_0012fcac;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_100);
  }
  else {
LAB_0012fcac:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_98._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  psVar7 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0.field_2._8_8_ = puVar4[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_c0._M_string_length = puVar4[1];
  *puVar4 = psVar7;
  puVar4[1] = 0;
  *(undefined1 *)psVar7 = 0;
  LogTools::SemanticErrorLogs(local_a0,&local_c0,identifier_name,line_number,character_number);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
LAB_0012fd8b:
  if (local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ArgumentCheck(const string& identifier_name, int line_number, int character_number, vector<SymbolType>& value_argument_type) {
    if (!handle_func_table->Find(identifier_name)) {
        return;
    }
    vector<SymbolType> argument_type;
    handle_func_table->GetTermArgumentType(identifier_name, argument_type);
    int argument_type_len = argument_type.size();
    int value_argument_type_len = value_argument_type.size();
    if (argument_type_len != value_argument_type_len) {
        g_log_tools->SemanticErrorLogs("argument list expected: " + std::to_string(argument_type_len) + ", but value argument list had: "
                + std::to_string(value_argument_type_len), identifier_name, line_number, character_number);
        return;
    }
    for (int i=0; i<value_argument_type_len; ++i) {
        if (argument_type[i] != value_argument_type[i]) {
            string str1 = symbol_type_string[argument_type[i]];
            string str2 = symbol_type_string[value_argument_type[i]];
            g_log_tools->SemanticErrorLogs("argument expected: " + str1 + ", but value argument had: " + str2, identifier_name, line_number, character_number);
        }
    }
}